

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

void __thiscall ncnn::ConvolutionDepthWise::~ConvolutionDepthWise(ConvolutionDepthWise *this)

{
  Layer *pLVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  pointer ppLVar5;
  pointer ppLVar6;
  long lVar7;
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__ConvolutionDepthWise_00145d68;
  ppLVar5 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar6 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar6 - (long)ppLVar5) >> 3)) {
    lVar7 = 0;
    do {
      if (ppLVar5[lVar7] != (Layer *)0x0) {
        (*ppLVar5[lVar7]->_vptr_Layer[1])();
        ppLVar5 = (this->quantize_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppLVar6 = (this->quantize_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)((ulong)((long)ppLVar6 - (long)ppLVar5) >> 3));
  }
  if (ppLVar6 != ppLVar5) {
    (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar5;
  }
  ppLVar5 = (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar6 = (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar6 - (long)ppLVar5) >> 3)) {
    lVar7 = 0;
    do {
      pLVar1 = ppLVar5[lVar7];
      if (pLVar1 != (Layer *)0x0) {
        (*pLVar1->_vptr_Layer[1])(pLVar1);
        ppLVar5 = (this->dequantize_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppLVar6 = (this->dequantize_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)((ulong)((long)ppLVar6 - (long)ppLVar5) >> 3));
  }
  if (ppLVar6 != ppLVar5) {
    (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppLVar5;
  }
  if (ppLVar5 != (pointer)0x0) {
    operator_delete(ppLVar5,(long)(this->dequantize_ops).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar5)
    ;
  }
  ppLVar5 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppLVar5 != (pointer)0x0) {
    operator_delete(ppLVar5,(long)(this->quantize_ops).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar5)
    ;
  }
  piVar2 = (this->bottom_blob_int8_scales).refcount;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      pvVar3 = (this->bottom_blob_int8_scales).data;
      pAVar4 = (this->bottom_blob_int8_scales).allocator;
      if (pAVar4 == (Allocator *)0x0) {
        if (pvVar3 != (void *)0x0) {
          free(*(void **)((long)pvVar3 + -8));
        }
      }
      else {
        (**(code **)(*(long *)pAVar4 + 8))();
      }
    }
  }
  (this->bottom_blob_int8_scales).data = (void *)0x0;
  (this->bottom_blob_int8_scales).refcount = (int *)0x0;
  (this->bottom_blob_int8_scales).elemsize = 0;
  (this->bottom_blob_int8_scales).cstep = 0;
  (this->bottom_blob_int8_scales).dims = 0;
  (this->bottom_blob_int8_scales).w = 0;
  (this->bottom_blob_int8_scales).h = 0;
  (this->bottom_blob_int8_scales).c = 0;
  piVar2 = (this->weight_data_int8_scales).refcount;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      pvVar3 = (this->weight_data_int8_scales).data;
      pAVar4 = (this->weight_data_int8_scales).allocator;
      if (pAVar4 == (Allocator *)0x0) {
        if (pvVar3 != (void *)0x0) {
          free(*(void **)((long)pvVar3 + -8));
        }
      }
      else {
        (**(code **)(*(long *)pAVar4 + 8))();
      }
    }
  }
  (this->weight_data_int8_scales).data = (void *)0x0;
  (this->weight_data_int8_scales).refcount = (int *)0x0;
  (this->weight_data_int8_scales).elemsize = 0;
  (this->weight_data_int8_scales).cstep = 0;
  (this->weight_data_int8_scales).dims = 0;
  (this->weight_data_int8_scales).w = 0;
  (this->weight_data_int8_scales).h = 0;
  (this->weight_data_int8_scales).c = 0;
  piVar2 = (this->bias_data).refcount;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      pvVar3 = (this->bias_data).data;
      pAVar4 = (this->bias_data).allocator;
      if (pAVar4 == (Allocator *)0x0) {
        if (pvVar3 != (void *)0x0) {
          free(*(void **)((long)pvVar3 + -8));
        }
      }
      else {
        (**(code **)(*(long *)pAVar4 + 8))();
      }
    }
  }
  (this->bias_data).data = (void *)0x0;
  (this->bias_data).refcount = (int *)0x0;
  (this->bias_data).elemsize = 0;
  (this->bias_data).cstep = 0;
  (this->bias_data).dims = 0;
  (this->bias_data).w = 0;
  (this->bias_data).h = 0;
  (this->bias_data).c = 0;
  piVar2 = (this->weight_data).refcount;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      pvVar3 = (this->weight_data).data;
      pAVar4 = (this->weight_data).allocator;
      if (pAVar4 == (Allocator *)0x0) {
        if (pvVar3 != (void *)0x0) {
          free(*(void **)((long)pvVar3 + -8));
        }
      }
      else {
        (**(code **)(*(long *)pAVar4 + 8))();
      }
    }
  }
  (this->weight_data).data = (void *)0x0;
  (this->weight_data).refcount = (int *)0x0;
  (this->weight_data).elemsize = 0;
  (this->weight_data).cstep = 0;
  (this->weight_data).dims = 0;
  (this->weight_data).w = 0;
  (this->weight_data).h = 0;
  (this->weight_data).c = 0;
  Layer::~Layer(&this->super_Layer);
  return;
}

Assistant:

ConvolutionDepthWise::~ConvolutionDepthWise()
{
    for (int i=0; i<(int)quantize_ops.size(); i++)
        delete quantize_ops[i];

    quantize_ops.clear();

    for (int i=0; i<(int)dequantize_ops.size(); i++)
        delete dequantize_ops[i];

    dequantize_ops.clear();
}